

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O1

bool __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x03'>::my_equal::operator()
          (my_equal *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *s1,span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *s2)

{
  size_t *psVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  size_type __n;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  pbVar2 = s1->_M_ptr;
  pbVar3 = s2->_M_ptr;
  __n = pbVar2->_M_string_length;
  if (__n == pbVar3->_M_string_length) {
    bVar7 = false;
    uVar6 = 0;
    lVar5 = 0;
    do {
      if ((__n != 0) &&
         (iVar4 = bcmp(*(void **)((long)&(pbVar2->_M_dataplus)._M_p + lVar5),
                       *(void **)((long)&(pbVar3->_M_dataplus)._M_p + lVar5),__n), iVar4 != 0)) {
        return bVar7;
      }
      bVar7 = 1 < uVar6;
      if (lVar5 == 0x40) {
        return bVar7;
      }
      __n = *(size_t *)((long)&pbVar2[1]._M_string_length + lVar5);
      uVar6 = uVar6 + 1;
      psVar1 = (size_t *)((long)&pbVar3[1]._M_string_length + lVar5);
      lVar5 = lVar5 + 0x20;
    } while (__n == *psVar1);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool operator()(const std::span<const std::string, N>& s1,
                    const std::span<const std::string, N>& s2) const noexcept {
      if constexpr (N > 0) {
        for (int i = 0; i < N; ++i) {
          if (s1[i] != s2[i]) {
            return false;
          }
        }
      }
      return true;
    }